

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_1f4955::writeReadLayers(string *tempDir,bool multiPart)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  half *phVar4;
  reference pvVar5;
  char *pcVar6;
  reference pvVar7;
  Header *pHVar8;
  Rgba *pRVar9;
  byte in_SIL;
  float fVar10;
  float fVar11;
  int x_6;
  int y_6;
  Array2D<Imf_3_2::Rgba> p3_5;
  RgbaInputFile in_8;
  int x_5;
  int y_5;
  Array2D<Imf_3_2::Rgba> p3_4;
  RgbaInputFile in_7;
  int x_4;
  int y_4;
  Array2D<Imf_3_2::Rgba> p3_3;
  RgbaInputFile in_6;
  OutputFile out_1;
  FrameBuffer fb_1;
  Header hdr_1;
  int x_3;
  int y_3;
  RgbaInputFile in_5;
  RgbaInputFile in_4;
  Array2D<Imf_3_2::Rgba> p3_2;
  int x_2;
  int y_2;
  RgbaInputFile in_3;
  RgbaInputFile in_2;
  Array2D<Imf_3_2::Rgba> p3_1;
  int x_1;
  int y_1;
  RgbaInputFile in_1;
  RgbaInputFile in;
  Array2D<Imf_3_2::Rgba> p3;
  OutputPart part1;
  OutputPart part0;
  MultiPartOutputFile out;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> fb;
  Header hdr;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  int x;
  int y;
  int partForFooLayer;
  Array2D<Imath_3_2::half> p2;
  Array2D<Imath_3_2::half> p1;
  int H;
  int W;
  string fileName;
  float in_stack_fffffffffffff52c;
  undefined4 in_stack_fffffffffffff530;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffff534;
  undefined4 in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff53c;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff548;
  undefined4 in_stack_fffffffffffff54c;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff55c;
  allocator<char> *in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff56c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff578;
  undefined4 in_stack_fffffffffffff57c;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffff580;
  int local_7f4;
  int local_7f0;
  allocator<char> local_7e9;
  string local_7e8 [32];
  Array2D<Imf_3_2::Rgba> local_7c8;
  allocator<char> local_7a9;
  string local_7a8 [32];
  Rgba local_788 [8];
  int local_748;
  int local_744;
  Array2D<Imf_3_2::Rgba> local_740;
  allocator<char> local_721;
  string local_720 [32];
  Rgba local_700 [8];
  int local_6c0;
  int local_6bc;
  Array2D<Imf_3_2::Rgba> local_6b8;
  allocator<char> local_699;
  string local_698 [32];
  Rgba local_678 [8];
  undefined1 local_638 [72];
  Slice local_5f0 [56];
  char local_5b8 [48];
  Channel local_588 [16];
  Channel local_578 [16];
  Vec2<float> local_568;
  Header local_560 [60];
  int local_524;
  int local_520;
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [32];
  Rgba local_4d0 [8];
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [32];
  Rgba local_440 [8];
  Array2D<Imf_3_2::Rgba> local_400;
  int local_3e4;
  int local_3e0;
  allocator<char> local_3d9;
  string local_3d8 [32];
  Rgba local_3b8 [8];
  allocator<char> local_371;
  string local_370 [32];
  Rgba local_350 [8];
  Array2D<Imf_3_2::Rgba> local_310;
  int local_2f4;
  int local_2f0;
  allocator<char> local_2e9;
  string local_2e8 [32];
  Rgba local_2c8 [8];
  allocator<char> local_281;
  string local_280 [32];
  Rgba local_260 [8];
  Array2D<Imf_3_2::Rgba> local_220;
  undefined1 local_208 [8];
  undefined1 local_200 [24];
  Slice local_1e8 [56];
  Slice local_1b0 [64];
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> local_170;
  Channel local_154 [16];
  Channel local_144 [19];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  Vec2<float> local_e8;
  Header local_e0 [64];
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_a0;
  uint16_t local_88;
  uint16_t local_86;
  int local_84;
  int local_80;
  uint local_7c;
  Array2D<Imath_3_2::half> local_78;
  Array2D<Imath_3_2::half> local_50;
  undefined4 local_38;
  undefined4 local_34;
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\nreading multi-layer file");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"\nreading multi-part file");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                 (char *)in_stack_fffffffffffff550);
  local_34 = 0xed;
  local_38 = 0x77;
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffff540,CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538)
             ,CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffff540,CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538)
             ,CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530));
  local_7c = (uint)((local_9 & 1) != 0);
  for (local_80 = 0; local_80 < 0x77; local_80 = local_80 + 1) {
    for (local_84 = 0; local_84 < 0xed; local_84 = local_84 + 1) {
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                 in_stack_fffffffffffff52c);
      phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_80);
      phVar4[local_84]._h = local_86;
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                 in_stack_fffffffffffff52c);
      phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_80);
      phVar4[local_84]._h = local_88;
    }
  }
  std::allocator<Imf_3_2::Header>::allocator((allocator<Imf_3_2::Header> *)0x21042f);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)in_stack_fffffffffffff550,
             CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
             (allocator_type *)in_stack_fffffffffffff540);
  std::allocator<Imf_3_2::Header>::~allocator((allocator<Imf_3_2::Header> *)0x210458);
  Imath_3_2::Vec2<float>::Vec2(&local_e8,0.0,0.0);
  Imf_3_2::Header::Header(local_e0,0xed,0x77,1.0,(Vec2 *)&local_e8,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_2::Header::setType((string *)local_e0);
  pvVar5 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[](&local_a0,0);
  Imf_3_2::Header::operator=(pvVar5,local_e0);
  pvVar5 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[](&local_a0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,
             (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
             in_stack_fffffffffffff560);
  Imf_3_2::Header::setName((string *)pvVar5);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  if ((local_9 & 1) != 0) {
    pvVar5 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[](&local_a0,1)
    ;
    Imf_3_2::Header::operator=(pvVar5,local_e0);
    pvVar5 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[](&local_a0,1)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff570,
               (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
               in_stack_fffffffffffff560);
    Imf_3_2::Header::setName((string *)pvVar5);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  Imf_3_2::Header::~Header(local_e0);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[](&local_a0,0);
  pcVar6 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_144,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar6,(Channel *)0x243823);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::operator[]
            (&local_a0,(long)(int)local_7c);
  pcVar6 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_154,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar6,(Channel *)"foo.R");
  std::allocator<Imf_3_2::FrameBuffer>::allocator((allocator<Imf_3_2::FrameBuffer> *)0x2107db);
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
            (in_stack_fffffffffffff550,CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548)
             ,(allocator_type *)in_stack_fffffffffffff540);
  std::allocator<Imf_3_2::FrameBuffer>::~allocator((allocator<Imf_3_2::FrameBuffer> *)0x210804);
  pvVar7 = std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::operator[]
                     (&local_170,0);
  phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,0);
  Imf_3_2::Slice::Slice(local_1b0,HALF,(char *)phVar4,2,0x1da,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)pvVar7,(Slice *)0x243823);
  pvVar7 = std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::operator[]
                     (&local_170,(long)(int)local_7c);
  phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,0);
  uVar12 = 0;
  Imf_3_2::Slice::Slice(local_1e8,HALF,(char *)phVar4,2,0x1da,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)pvVar7,(Slice *)"foo.R");
  pcVar6 = (char *)std::__cxx11::string::c_str();
  pHVar8 = std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::data
                     ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)0x210964);
  uVar1 = (uint)local_9;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)(local_200 + 8),pcVar6,pHVar8,(uVar1 & 1) + 1,false,iVar2);
  Imf_3_2::OutputPart::OutputPart((OutputPart *)local_200,(MultiPartOutputFile *)(local_200 + 8),0);
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::operator[](&local_170,0)
  ;
  Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)local_200);
  Imf_3_2::OutputPart::writePixels((int)local_200);
  if ((local_9 & 1) != 0) {
    Imf_3_2::OutputPart::OutputPart
              ((OutputPart *)local_208,(MultiPartOutputFile *)(local_200 + 8),1);
    std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::operator[]
              (&local_170,1);
    Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)local_208);
    Imf_3_2::OutputPart::writePixels((int)local_208);
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)(local_200 + 8));
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector
            ((vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)
             in_stack_fffffffffffff540);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
            ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)in_stack_fffffffffffff540)
  ;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (in_stack_fffffffffffff580,CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578)
             ,(long)in_stack_fffffffffffff570);
  if ((local_9 & 1) == 0) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff570,
               (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
               in_stack_fffffffffffff560);
    iVar2 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_2c8,0,pcVar6,local_2e8,iVar2);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_220,0);
    Imf_3_2::RgbaInputFile::setFrameBuffer(local_2c8,(ulong)pRVar9,1);
    Imf_3_2::RgbaInputFile::readPixels((int)local_2c8,0);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_2c8);
  }
  else {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff570,
               (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
               in_stack_fffffffffffff560);
    iVar2 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_260,pcVar6,local_280,iVar2);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator(&local_281);
    pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_220,0);
    Imf_3_2::RgbaInputFile::setFrameBuffer(local_260,(ulong)pRVar9,1);
    Imf_3_2::RgbaInputFile::readPixels((int)local_260,0);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_260);
  }
  local_2f0 = 0;
  do {
    if (0x76 < local_2f0) {
      Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffff534,uVar12));
      Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
                (in_stack_fffffffffffff580,
                 CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                 (long)in_stack_fffffffffffff570);
      if ((local_9 & 1) == 0) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff570,
                   (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                   in_stack_fffffffffffff560);
        iVar2 = Imf_3_2::globalThreadCount();
        Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_3b8,pcVar6,local_3d8,iVar2);
        std::__cxx11::string::~string(local_3d8);
        std::allocator<char>::~allocator(&local_3d9);
        pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_310,0);
        Imf_3_2::RgbaInputFile::setFrameBuffer(local_3b8,(ulong)pRVar9,1);
        Imf_3_2::RgbaInputFile::readPixels((int)local_3b8,0);
        Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_3b8);
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff570,
                   (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                   in_stack_fffffffffffff560);
        iVar2 = Imf_3_2::globalThreadCount();
        Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_350,1,pcVar6,local_370,iVar2);
        std::__cxx11::string::~string(local_370);
        std::allocator<char>::~allocator(&local_371);
        pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_310,0);
        Imf_3_2::RgbaInputFile::setFrameBuffer(local_350,(ulong)pRVar9,1);
        Imf_3_2::RgbaInputFile::readPixels((int)local_350,0);
        Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_350);
      }
      local_3e0 = 0;
      do {
        if (0x76 < local_3e0) {
          Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                    ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffff534,uVar12));
          Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
                    (in_stack_fffffffffffff580,
                     CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                     (long)in_stack_fffffffffffff570);
          if ((local_9 & 1) == 0) {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff570,
                       (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                       in_stack_fffffffffffff560);
            iVar2 = Imf_3_2::globalThreadCount();
            Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_4d0,pcVar6,local_4f0,iVar2)
            ;
            std::__cxx11::string::~string(local_4f0);
            std::allocator<char>::~allocator(&local_4f1);
            pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,0);
            Imf_3_2::RgbaInputFile::setFrameBuffer(local_4d0,(ulong)pRVar9,1);
            Imf_3_2::RgbaInputFile::readPixels((int)local_4d0,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff570,
                       (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                       in_stack_fffffffffffff560);
            Imf_3_2::RgbaInputFile::setLayerName((string *)local_4d0);
            std::__cxx11::string::~string(local_518);
            std::allocator<char>::~allocator(&local_519);
            pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,0);
            Imf_3_2::RgbaInputFile::setFrameBuffer(local_4d0,(ulong)pRVar9,1);
            Imf_3_2::RgbaInputFile::readPixels((int)local_4d0,0x3b);
            Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_4d0);
          }
          else {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff570,
                       (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                       in_stack_fffffffffffff560);
            iVar2 = Imf_3_2::globalThreadCount();
            Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_440,pcVar6,local_460,iVar2)
            ;
            std::__cxx11::string::~string(local_460);
            std::allocator<char>::~allocator(&local_461);
            pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,0);
            Imf_3_2::RgbaInputFile::setFrameBuffer(local_440,(ulong)pRVar9,1);
            Imf_3_2::RgbaInputFile::readPixels((int)local_440,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff570,
                       (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                       in_stack_fffffffffffff560);
            Imf_3_2::RgbaInputFile::setPartAndLayer((int)local_440,(string *)0x1);
            std::__cxx11::string::~string(local_488);
            std::allocator<char>::~allocator(&local_489);
            pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,0);
            Imf_3_2::RgbaInputFile::setFrameBuffer(local_440,(ulong)pRVar9,1);
            Imf_3_2::RgbaInputFile::readPixels((int)local_440,0x3b);
            Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_440);
          }
          local_520 = 0;
          do {
            if (0x76 < local_520) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                        ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffff534,uVar12));
              if ((local_9 & 1) == 0) {
                Imath_3_2::Vec2<float>::Vec2(&local_568,0.0,0.0);
                Imf_3_2::Header::Header
                          (local_560,0xed,0x77,1.0,(Vec2 *)&local_568,1.0,INCREASING_Y,
                           ZIP_COMPRESSION);
                pcVar6 = (char *)Imf_3_2::Header::channels();
                Imf_3_2::Channel::Channel(local_578,HALF,1,1,false);
                Imf_3_2::ChannelList::insert(pcVar6,(Channel *)0x24f329);
                pcVar6 = (char *)Imf_3_2::Header::channels();
                Imf_3_2::Channel::Channel(local_588,HALF,1,1,false);
                Imf_3_2::ChannelList::insert(pcVar6,(Channel *)"foo.Y");
                Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x211e44);
                phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,0);
                Imf_3_2::Slice::Slice(local_5f0,HALF,(char *)phVar4,2,0x1da,1,1,0.0,false,false);
                Imf_3_2::FrameBuffer::insert(local_5b8,(Slice *)0x24f329);
                phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,0);
                uVar12 = 0;
                Imf_3_2::Slice::Slice
                          ((Slice *)(local_638 + 0x10),HALF,(char *)phVar4,2,0x1da,1,1,0.0,false,
                           false);
                Imf_3_2::FrameBuffer::insert(local_5b8,(Slice *)"foo.Y");
                pcVar6 = (char *)std::__cxx11::string::c_str();
                iVar2 = Imf_3_2::globalThreadCount();
                Imf_3_2::OutputFile::OutputFile((OutputFile *)local_638,pcVar6,local_560,iVar2);
                Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)local_638);
                Imf_3_2::OutputFile::writePixels((int)local_638);
                Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_638);
                Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x211fce);
                Imf_3_2::Header::~Header(local_560);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff570,
                           (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                           in_stack_fffffffffffff560);
                iVar2 = Imf_3_2::globalThreadCount();
                Imf_3_2::RgbaInputFile::RgbaInputFile
                          ((RgbaInputFile *)local_678,pcVar6,local_698,iVar2);
                std::__cxx11::string::~string(local_698);
                std::allocator<char>::~allocator(&local_699);
                Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
                          (in_stack_fffffffffffff580,
                           CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                           (long)in_stack_fffffffffffff570);
                pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_6b8,0);
                Imf_3_2::RgbaInputFile::setFrameBuffer(local_678,(ulong)pRVar9,1);
                Imf_3_2::RgbaInputFile::readPixels((int)local_678,0);
                for (local_6bc = 0; local_6bc < 0x77; local_6bc = local_6bc + 1) {
                  for (local_6c0 = 0; local_6c0 < 0xed; local_6c0 = local_6c0 + 1) {
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_6b8,(long)local_6bc);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_6bc);
                    fVar11 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                      __assert_fail("p3[y][x].r == p1[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x236,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_6b8,(long)local_6bc);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_6bc);
                    fVar11 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                      __assert_fail("p3[y][x].g == p1[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x237,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_6b8,(long)local_6bc);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_6bc);
                    fVar11 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                      __assert_fail("p3[y][x].b == p1[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x238,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_6b8,(long)local_6bc);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != 1.0) || (NAN(fVar10))) {
                      __assert_fail("p3[y][x].a == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x239,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                  }
                }
                Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                          ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_678);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff570,
                           (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                           in_stack_fffffffffffff560);
                iVar2 = Imf_3_2::globalThreadCount();
                Imf_3_2::RgbaInputFile::RgbaInputFile
                          ((RgbaInputFile *)local_700,pcVar6,local_720,iVar2);
                std::__cxx11::string::~string(local_720);
                std::allocator<char>::~allocator(&local_721);
                Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
                          (in_stack_fffffffffffff580,
                           CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                           (long)in_stack_fffffffffffff570);
                pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_740,0);
                Imf_3_2::RgbaInputFile::setFrameBuffer(local_700,(ulong)pRVar9,1);
                Imf_3_2::RgbaInputFile::readPixels((int)local_700,0);
                for (local_744 = 0; local_744 < 0x77; local_744 = local_744 + 1) {
                  for (local_748 = 0; local_748 < 0xed; local_748 = local_748 + 1) {
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_740,(long)local_744);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_744);
                    fVar11 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                      __assert_fail("p3[y][x].r == p2[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x249,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_740,(long)local_744);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_744);
                    fVar11 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                      __assert_fail("p3[y][x].g == p2[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x24a,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_740,(long)local_744);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_744);
                    fVar11 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                      __assert_fail("p3[y][x].b == p2[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x24b,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_740,(long)local_744);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != 1.0) || (NAN(fVar10))) {
                      __assert_fail("p3[y][x].a == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x24c,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                  }
                }
                Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                          ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_700);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff570,
                           (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                           in_stack_fffffffffffff560);
                iVar2 = Imf_3_2::globalThreadCount();
                Imf_3_2::RgbaInputFile::RgbaInputFile
                          ((RgbaInputFile *)local_788,pcVar6,local_7a8,iVar2);
                std::__cxx11::string::~string(local_7a8);
                std::allocator<char>::~allocator(&local_7a9);
                Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
                          (in_stack_fffffffffffff580,
                           CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),
                           (long)in_stack_fffffffffffff570);
                pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,0);
                Imf_3_2::RgbaInputFile::setFrameBuffer(local_788,(ulong)pRVar9,1);
                Imf_3_2::RgbaInputFile::readPixels((int)local_788,0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff570,
                           (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),
                           in_stack_fffffffffffff560);
                Imf_3_2::RgbaInputFile::setLayerName((string *)local_788);
                std::__cxx11::string::~string(local_7e8);
                std::allocator<char>::~allocator(&local_7e9);
                pRVar9 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,0);
                Imf_3_2::RgbaInputFile::setFrameBuffer(local_788,(ulong)pRVar9,1);
                Imf_3_2::RgbaInputFile::readPixels((int)local_788,0x3b);
                for (local_7f0 = 0; local_7f0 < 0x77; local_7f0 = local_7f0 + 1) {
                  for (local_7f4 = 0; local_7f4 < 0xed; local_7f4 = local_7f4 + 1) {
                    if (local_7f0 < 0x3b) {
                      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,(long)local_7f0);
                      fVar10 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_7f0);
                      fVar11 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                        __assert_fail("p3[y][x].r == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x264,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,(long)local_7f0);
                      fVar10 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_7f0);
                      fVar11 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                        __assert_fail("p3[y][x].g == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x265,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,(long)local_7f0);
                      fVar10 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_7f0);
                      fVar11 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                        __assert_fail("p3[y][x].b == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x266,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                    }
                    else {
                      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,(long)local_7f0);
                      fVar10 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_7f0);
                      fVar11 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                        __assert_fail("p3[y][x].r == p2[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x26a,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,(long)local_7f0);
                      fVar10 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_7f0);
                      fVar11 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                        __assert_fail("p3[y][x].g == p2[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x26b,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,(long)local_7f0);
                      fVar10 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_7f0);
                      fVar11 = Imath_3_2::half::operator_cast_to_float
                                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                        __assert_fail("p3[y][x].b == p2[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x26c,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                    }
                    Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_7c8,(long)local_7f0);
                    fVar10 = Imath_3_2::half::operator_cast_to_float
                                       ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                    if ((fVar10 != 1.0) || (NAN(fVar10))) {
                      __assert_fail("p3[y][x].a == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x26f,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                  }
                }
                Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                          ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_788);
              }
              pcVar6 = (char *)std::__cxx11::string::c_str();
              remove(pcVar6);
              Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                        ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffff534,uVar12));
              Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                        ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffff534,uVar12));
              std::__cxx11::string::~string(local_30);
              return;
            }
            for (local_524 = 0; local_524 < 0xed; local_524 = local_524 + 1) {
              if (local_520 < 0x3b) {
                Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,(long)local_520);
                fVar10 = Imath_3_2::half::operator_cast_to_float
                                   ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_520);
                fVar11 = Imath_3_2::half::operator_cast_to_float
                                   ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                  __assert_fail("p3[y][x].r == p1[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                ,0x202,
                                "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                               );
                }
              }
              else {
                Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,(long)local_520);
                fVar10 = Imath_3_2::half::operator_cast_to_float
                                   ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_520);
                fVar11 = Imath_3_2::half::operator_cast_to_float
                                   ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
                if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
                  __assert_fail("p3[y][x].r == p2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                ,0x204,
                                "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                               );
                }
              }
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,(long)local_520);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
              if ((fVar10 != 0.0) || (NAN(fVar10))) {
                __assert_fail("p3[y][x].g == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                              ,0x206,
                              "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                             );
              }
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,(long)local_520);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
              if ((fVar10 != 0.0) || (NAN(fVar10))) {
                __assert_fail("p3[y][x].b == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                              ,0x207,
                              "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                             );
              }
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_400,(long)local_520);
              fVar10 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
              if ((fVar10 != 1.0) || (NAN(fVar10))) {
                __assert_fail("p3[y][x].a == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                              ,0x208,
                              "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                             );
              }
            }
            local_520 = local_520 + 1;
          } while( true );
        }
        for (local_3e4 = 0; local_3e4 < 0xed; local_3e4 = local_3e4 + 1) {
          Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_310,(long)local_3e0);
          fVar10 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
          Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_78,(long)local_3e0);
          fVar11 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
          if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x1db,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_310,(long)local_3e0);
          fVar10 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
          if ((fVar10 != 0.0) || (NAN(fVar10))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x1dc,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_310,(long)local_3e0);
          fVar10 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
          if ((fVar10 != 0.0) || (NAN(fVar10))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x1dd,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_310,(long)local_3e0);
          fVar10 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
          if ((fVar10 != 1.0) || (NAN(fVar10))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x1de,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
        }
        local_3e0 = local_3e0 + 1;
      } while( true );
    }
    for (local_2f4 = 0; local_2f4 < 0xed; local_2f4 = local_2f4 + 1) {
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_220,(long)local_2f0);
      fVar10 = Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
      Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_50,(long)local_2f0);
      fVar11 = Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
        __assert_fail("p3[y][x].r == p1[y][x]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1be,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_220,(long)local_2f0);
      fVar10 = Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        __assert_fail("p3[y][x].g == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1bf,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_220,(long)local_2f0);
      fVar10 = Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        __assert_fail("p3[y][x].b == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1c0,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_220,(long)local_2f0);
      fVar10 = Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffff534,uVar12));
      if ((fVar10 != 1.0) || (NAN(fVar10))) {
        __assert_fail("p3[y][x].a == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1c1,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
    }
    local_2f0 = local_2f0 + 1;
  } while( true );
}

Assistant:

void
writeReadLayers (const std::string& tempDir, bool multiPart)
{
    if (multiPart) { cout << "\nreading multi-part file" << endl; }
    else
    {
        cout << "\nreading multi-layer file" << endl;
    }

    std::string fileName = tempDir + "imf_test_multi_layer_rgba.exr";

    const int W = 237;
    const int H = 119;

    Array2D<half> p1 (H, W);
    Array2D<half> p2 (H, W);

    int partForFooLayer = 0;

    if (multiPart) { partForFooLayer = 1; }

    for (int y = 0; y < H; ++y)
    {
        for (int x = 0; x < W; ++x)
        {
            p1[y][x] = half (y % 23 + x % 17);
            p2[y][x] = half (y % 29 + x % 19);
        }
    }

    {

        std::vector<Header> headers (2);
        {
            Header hdr (W, H);
            hdr.setType (SCANLINEIMAGE);
            headers[0] = hdr;
            headers[0].setName ("rgba_layer");
            if (multiPart)
            {
                headers[1] = hdr;
                headers[1].setName ("foo_layer");
            }
        }

        headers[0].channels ().insert ("R", Channel (HALF));
        headers[partForFooLayer].channels ().insert ("foo.R", Channel (HALF));

        vector<FrameBuffer> fb (2);

        fb[0].insert (
            "R",
            Slice (
                HALF,                // type
                (char*) &p1[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        fb[partForFooLayer].insert (
            "foo.R",
            Slice (
                HALF,                // type
                (char*) &p2[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        MultiPartOutputFile out (
            fileName.c_str (), headers.data (), multiPart ? 2 : 1);
        OutputPart part0 = OutputPart (out, 0);
        part0.setFrameBuffer (fb[0]);
        part0.writePixels (H);
        if (multiPart)
        {
            OutputPart part1 = OutputPart (out, 1);
            part1.setFrameBuffer (fb[1]);
            part1.writePixels (H);
        }
    }

    {

        Array2D<Rgba> p3 (H, W);
        if (multiPart)
        {
            RgbaInputFile in (fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }
        else
        {
            RgbaInputFile in (0, fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p1[y][x]);
                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {

        Array2D<Rgba> p3 (H, W);

        if (multiPart)
        {
            RgbaInputFile in (1, fileName.c_str (), "foo");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }
        else
        {
            RgbaInputFile in (fileName.c_str (), "foo");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p2[y][x]);
                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {
        Array2D<Rgba> p3 (H, W);
        if (multiPart)
        {
            RgbaInputFile in (fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setPartAndLayer (1, "foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);
        }
        else
        {
            RgbaInputFile in (fileName.c_str (), "");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setLayerName ("foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                if (y < H / 2)
                    assert (p3[y][x].r == p1[y][x]);
                else
                    assert (p3[y][x].r == p2[y][x]);

                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    if (!multiPart)
    {
        {
            Header hdr (W, H);
            hdr.channels ().insert ("Y", Channel (HALF));
            hdr.channels ().insert ("foo.Y", Channel (HALF));

            FrameBuffer fb;

            fb.insert (
                "Y",
                Slice (
                    HALF,                // type
                    (char*) &p1[0][0],   // base
                    sizeof (half),       // xStride
                    sizeof (half) * W)); // yStride

            fb.insert (
                "foo.Y",
                Slice (
                    HALF,                // type
                    (char*) &p2[0][0],   // base
                    sizeof (half),       // xStride
                    sizeof (half) * W)); // yStride

            OutputFile out (fileName.c_str (), hdr);
            out.setFrameBuffer (fb);
            out.writePixels (H);
        }

        {
            RgbaInputFile in (fileName.c_str (), "");

            Array2D<Rgba> p3 (H, W);
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    assert (p3[y][x].r == p1[y][x]);
                    assert (p3[y][x].g == p1[y][x]);
                    assert (p3[y][x].b == p1[y][x]);
                    assert (p3[y][x].a == 1);
                }
            }
        }

        {
            RgbaInputFile in (fileName.c_str (), "foo");

            Array2D<Rgba> p3 (H, W);
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    assert (p3[y][x].r == p2[y][x]);
                    assert (p3[y][x].g == p2[y][x]);
                    assert (p3[y][x].b == p2[y][x]);
                    assert (p3[y][x].a == 1);
                }
            }
        }

        {
            RgbaInputFile in (fileName.c_str (), "");

            Array2D<Rgba> p3 (H, W);

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setLayerName ("foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    if (y < H / 2)
                    {
                        assert (p3[y][x].r == p1[y][x]);
                        assert (p3[y][x].g == p1[y][x]);
                        assert (p3[y][x].b == p1[y][x]);
                    }
                    else
                    {
                        assert (p3[y][x].r == p2[y][x]);
                        assert (p3[y][x].g == p2[y][x]);
                        assert (p3[y][x].b == p2[y][x]);
                    }

                    assert (p3[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName.c_str ());
}